

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

FrameBuffer * __thiscall Imf_3_4::InputFile::frameBuffer(InputFile *this)

{
  pthread_mutex_t *__mutex;
  element_type *peVar1;
  _Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
  this_00;
  int iVar2;
  FrameBuffer *pFVar3;
  
  __mutex = (pthread_mutex_t *)
            (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    peVar1 = (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this_00.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl =
         (peVar1->_compositor)._M_t.
         super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
         ._M_t.
         super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
         .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>;
    if (this_00.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl ==
        (CompositeDeepScanLine *)0x0) {
      pFVar3 = &peVar1->_cacheFrameBuffer;
    }
    else {
      pFVar3 = CompositeDeepScanLine::frameBuffer
                         ((CompositeDeepScanLine *)
                          this_00.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>.
                          _M_head_impl);
    }
    pthread_mutex_unlock(__mutex);
    return pFVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const FrameBuffer&
InputFile::frameBuffer () const
{
    // Really not actual protection once this returns...
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif

    if (_data->_compositor) { return _data->_compositor->frameBuffer (); }

    return _data->_cacheFrameBuffer;
}